

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
::rebalance_or_split
          (btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
           *this,iterator *iter)

{
  size_type sVar1;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  *pbVar2;
  char cVar3;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  bVar4;
  uint uVar5;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  *pbVar6;
  ulong uVar7;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  *pbVar8;
  btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  *this_00;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  *pbVar9;
  ulong uVar10;
  int iVar11;
  allocator_type *alloc;
  char *__function;
  byte bVar12;
  long lVar13;
  int i;
  size_type sVar14;
  iterator *iter_00;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  bVar15;
  uint uVar16;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  bVar17;
  size_type sVar18;
  allocator_type *in_R9;
  bool bVar19;
  iterator parent_iter;
  iterator local_40;
  
  pbVar9 = iter->node;
  if (((ulong)pbVar9 & 7) != 0) goto LAB_001b82ee;
  bVar4 = pbVar9[0xb];
  alloc = (allocator_type *)(ulong)(byte)bVar4;
  bVar17 = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
            )0x1e;
  if (bVar4 != (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                )0x0) {
    bVar17 = bVar4;
  }
  if (pbVar9[10] != bVar17) {
    __assert_fail("node->count() == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb53,
                  "void phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                 );
  }
  if (pbVar9[10] !=
      (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
       )0x1e) {
    __assert_fail("kNodeValues == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb54,
                  "void phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                 );
  }
  this_00 = *(btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
              **)pbVar9;
  if (pbVar9 == (this->root_).
                super__Tuple_impl<0UL,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*>
                .
                super__Tuple_impl<1UL,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*>
                .
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*,_false>
                ._M_head_impl) {
    this_00 = (btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
               *)new_internal_node(this_00,(node_type *)iter);
    btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
    ::init_child((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                  *)this_00,0,
                 (this->root_).
                 super__Tuple_impl<0UL,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*>
                 .
                 super__Tuple_impl<1UL,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*>
                 .
                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*>
                 .
                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*,_false>
                 ._M_head_impl);
    (this->root_).
    super__Tuple_impl<0UL,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>_*,_false>
    ._M_head_impl =
         (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
          *)this_00;
    iter_00 = (iterator *)0x0;
    pbVar9 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
             ::child((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                      *)this_00,0);
    if (((ulong)pbVar9 & 7) != 0) goto LAB_001b82ee;
    if (pbVar9[0xb] !=
        (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
         )0x0) {
      iter_00 = (iterator *)0x0;
      pbVar9 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
               ::child((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                        *)this_00,0);
      if (pbVar9 != this->rightmost_) {
        __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xba0,
                      "void phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                     );
      }
    }
    goto LAB_001b7f8a;
  }
  if ((ulong)(byte)pbVar9[8] == 0) goto LAB_001b7ea4;
  pbVar6 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
           ::child((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                    *)this_00,(ulong)(byte)pbVar9[8] - 1);
  if (((ulong)pbVar6 & 7) != 0) goto LAB_001b82ee;
  if ((pbVar6[0xb] !=
       (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
        )0x0) &&
     (pbVar6[0xb] !=
      (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
       )0x1e)) {
    __assert_fail("left->max_count() == kNodeValues",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb5c,
                  "void phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                 );
  }
  bVar4 = pbVar6[10];
  uVar7 = (ulong)(byte)bVar4;
  if (uVar7 < 0x1e) {
    bVar12 = (byte)(0x1eU - (char)bVar4) >> (iter->position < 0x1e);
    sVar18 = 1;
    if (1 < bVar12) {
      sVar18 = (size_type)bVar12;
    }
    bVar17 = SUB81(sVar18,0);
    pbVar9 = iter->node;
    iVar11 = (int)sVar18;
    if ((iter->position < iVar11) &&
       (alloc = (allocator_type *)(ulong)(iVar11 + (uint)(byte)bVar4),
       0x1d < (byte)(iVar11 + (uint)(byte)bVar4))) goto LAB_001b7ea4;
    if (((ulong)pbVar9 & 7) == 0) {
      uVar10 = *(ulong *)pbVar6;
      if (uVar10 != *(ulong *)pbVar9) {
        __assert_fail("parent() == right->parent()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x87f,
                      "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                     );
      }
      if ((byte)pbVar6[8] + 1 != (uint)(byte)pbVar9[8]) {
        __assert_fail("position() + 1 == right->position()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x880,
                      "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                     );
      }
      if ((byte)pbVar9[10] < (byte)bVar4) {
        __assert_fail("right->count() >= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x881,
                      "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                     );
      }
      if ((byte)pbVar9[10] < (byte)bVar17) {
        __assert_fail("to_move <= right->count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x883,
                      "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                     );
      }
      if ((uVar10 & 7) == 0) {
        *(undefined8 *)(pbVar6 + uVar7 * 8 + 0xc) =
             *(undefined8 *)(uVar10 + 0xc + (ulong)(byte)pbVar6[8] * 8);
        uVar10 = (ulong)(iVar11 - 1);
        btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
        ::uninitialized_move_n(pbVar9,uVar10,0,uVar7 + 1,pbVar6,in_R9);
        uVar7 = *(ulong *)pbVar6;
        if ((uVar7 & 7) == 0) {
          bVar4 = pbVar6[8];
          *(undefined4 *)(uVar7 + 0xc + (ulong)(byte)bVar4 * 8) =
               *(undefined4 *)(pbVar9 + uVar10 * 8 + 0xc);
          *(undefined4 *)(uVar7 + 0x10 + (ulong)(byte)bVar4 * 8) =
               *(undefined4 *)(pbVar9 + uVar10 * 8 + 0x10);
          bVar4 = pbVar9[10];
          if (bVar17 != bVar4) {
            pbVar8 = pbVar9 + 0xc;
            do {
              pbVar2 = pbVar8 + (uint)(iVar11 * 8);
              *(undefined4 *)pbVar8 = *(undefined4 *)pbVar2;
              *(undefined4 *)(pbVar8 + 4) = *(undefined4 *)(pbVar2 + 4);
              pbVar8 = pbVar8 + 8;
            } while (pbVar2 + 8 != pbVar9 + (ulong)(byte)bVar4 * 8 + 0xc);
          }
          if (pbVar6[0xb] ==
              (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
               )0x0) {
            sVar14 = 0;
            do {
              bVar4 = pbVar6[10];
              sVar1 = sVar14 + 1;
              pbVar8 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                       ::child(pbVar9,sVar14);
              btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
              ::init_child(pbVar6,(int)sVar14 + (uint)(byte)bVar4 + 1,pbVar8);
              sVar14 = sVar1;
            } while (sVar18 != sVar1);
            if ((byte)bVar17 <= (byte)pbVar9[10]) {
              lVar13 = 0;
              do {
                sVar14 = sVar18 + lVar13;
                bVar4 = pbVar9[0xb];
                if (pbVar9[0xb] ==
                    (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                     )0x0) {
                  bVar4 = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                           )0x1e;
                }
                if ((int)(uint)(byte)bVar4 < (int)sVar14) {
                  __assert_fail("i + to_move <= right->max_count()",
                                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                ,0x89c,
                                "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                               );
                }
                pbVar8 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                         ::child(pbVar9,sVar14);
                btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                ::init_child(pbVar9,(int)lVar13,pbVar8);
                btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                ::mutable_child(pbVar9,sVar14);
                bVar19 = lVar13 < (long)((byte)pbVar9[10] - sVar18);
                lVar13 = lVar13 + 1;
              } while (bVar19);
            }
          }
          pbVar6[10] = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                        )((char)pbVar6[10] + (char)bVar17);
          pbVar9[10] = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                        )((char)pbVar9[10] - (char)bVar17);
          pbVar9 = iter->node;
          if (((ulong)pbVar9 & 7) == 0) {
            bVar4 = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                     )0x1e;
            if (pbVar9[0xb] !=
                (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                 )0x0) {
              bVar4 = pbVar9[0xb];
            }
            if ((uint)(byte)bVar4 - (uint)(byte)pbVar9[10] == iVar11) {
              iVar11 = iter->position - iVar11;
              iter->position = iVar11;
              if (iVar11 < 0) {
                iter->position = (uint)(byte)pbVar6[10] + iVar11 + 1;
                iter->node = pbVar6;
                pbVar9 = pbVar6;
              }
              bVar4 = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                       )0x1e;
              if (pbVar9[0xb] !=
                  (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                   )0x0) {
                bVar4 = pbVar9[0xb];
              }
              if ((byte)pbVar9[10] < (byte)bVar4) {
                return;
              }
              __assert_fail("node->count() < node->max_count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb70,
                            "void phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                           );
            }
            __assert_fail("node->max_count() - node->count() == to_move",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb69,
                          "void phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                         );
          }
          goto LAB_001b82ee;
        }
      }
      goto LAB_001b839b;
    }
LAB_001b8381:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, Off..." /* TRUNCATED STRING LITERAL */
    ;
  }
  else {
    pbVar9 = iter->node;
LAB_001b7ea4:
    if ((((ulong)pbVar9 & 7) == 0) && (((ulong)this_00 & 7) == 0)) {
      iter_00 = (iterator *)(ulong)(byte)pbVar9[8];
      if ((byte)pbVar9[8] <
          (byte)*(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                  *)((long)&this_00->rightmost_ + 2)) {
        iter_00 = (iterator *)((long)&iter_00->node + 1);
        pbVar9 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                 ::child((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                          *)this_00,(size_type)iter_00);
        if (((ulong)pbVar9 & 7) != 0) goto LAB_001b82ee;
        if ((pbVar9[0xb] !=
             (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
              )0x0) &&
           (pbVar9[0xb] !=
            (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
             )0x1e)) {
          __assert_fail("right->max_count() == kNodeValues",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb79,
                        "void phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                       );
        }
        bVar4 = pbVar9[10];
        if ((byte)bVar4 < 0x1e) {
          bVar12 = (byte)(0x1eU - (char)bVar4) >> (0 < iter->position);
          uVar16 = 1;
          if (1 < bVar12) {
            uVar16 = (uint)bVar12;
          }
          pbVar6 = iter->node;
          if (((ulong)pbVar6 & 7) != 0) goto LAB_001b82ee;
          bVar17 = pbVar6[10];
          alloc = (allocator_type *)(ulong)(byte)bVar17;
          iter_00 = (iterator *)(ulong)((byte)bVar17 - uVar16);
          if ((iter->position <= (int)((byte)bVar17 - uVar16)) || (uVar16 + (byte)bVar4 < 0x1e)) {
            if (*(long *)pbVar6 != *(long *)pbVar9) {
              __assert_fail("parent() == right->parent()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ab,
                            "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                           );
            }
            if ((byte)pbVar6[8] + 1 != (uint)(byte)pbVar9[8]) {
              __assert_fail("position() + 1 == right->position()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ac,
                            "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                           );
            }
            if ((byte)bVar17 < (byte)bVar4) {
              __assert_fail("count() >= right->count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ad,
                            "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                           );
            }
            bVar15 = SUB41(uVar16,0);
            if ((byte)bVar17 < (byte)bVar15) {
              __assert_fail("to_move <= count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8af,
                            "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                           );
            }
            uVar7 = (ulong)uVar16;
            if ((byte)bVar4 < (byte)bVar15) {
              btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
              ::uninitialized_move_n(pbVar9,(ulong)(byte)bVar4,0,uVar7,pbVar9,in_R9);
              if ((*(ulong *)pbVar6 & 7) == 0) {
                *(undefined8 *)(pbVar9 + uVar7 * 8 + 4) =
                     *(undefined8 *)(*(ulong *)pbVar6 + 0xc + (ulong)(byte)pbVar6[8] * 8);
                sVar18 = (size_type)(int)(~(uint)(byte)pbVar9[10] + uVar16);
                btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                ::uninitialized_move_n
                          (pbVar6,sVar18,(byte)pbVar6[10] - sVar18,(ulong)(byte)pbVar9[10],pbVar9,
                           in_R9);
                if (sVar18 != uVar7 - 1) {
                  bVar4 = pbVar6[10];
                  lVar13 = 0;
                  do {
                    pbVar8 = pbVar6 + lVar13 + ((ulong)(byte)bVar4 - (uVar7 - 1)) * 8 + 0xc;
                    *(undefined4 *)(pbVar9 + lVar13 + 0xc) = *(undefined4 *)pbVar8;
                    *(undefined4 *)(pbVar9 + lVar13 + 0x10) = *(undefined4 *)(pbVar8 + 4);
                    lVar13 = lVar13 + 8;
                  } while (pbVar8 + 8 != pbVar6 + ((byte)bVar4 - sVar18) * 8 + 0xc);
                }
LAB_001b81db:
                uVar10 = *(ulong *)pbVar6;
                if ((uVar10 & 7) == 0) {
                  bVar4 = pbVar6[8];
                  bVar17 = pbVar6[10];
                  *(undefined4 *)(uVar10 + 0xc + (ulong)(byte)bVar4 * 8) =
                       *(undefined4 *)(pbVar6 + ((byte)bVar17 - uVar7) * 8 + 0xc);
                  *(undefined4 *)(uVar10 + 0x10 + (ulong)(byte)bVar4 * 8) =
                       *(undefined4 *)(pbVar6 + ((byte)bVar17 - uVar7) * 8 + 0x10);
                  if (pbVar6[0xb] ==
                      (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                       )0x0) {
                    sVar18 = (size_type)(byte)pbVar9[10];
                    do {
                      pbVar8 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                               ::child(pbVar9,sVar18);
                      btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                      ::init_child(pbVar9,(int)sVar18 + (uint)bVar12 + (uint)(bVar12 == 0),pbVar8);
                      btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                      ::mutable_child(pbVar9,sVar18);
                      bVar19 = sVar18 != 0;
                      sVar18 = sVar18 - 1;
                    } while (bVar19);
                    iVar11 = 1 - uVar16;
                    i = 0;
                    do {
                      pbVar8 = btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                               ::child(pbVar6,(long)(int)((uint)(byte)pbVar6[10] + iVar11));
                      btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                      ::init_child(pbVar9,i,pbVar8);
                      btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                      ::mutable_child(pbVar6,(long)(int)((uint)(byte)pbVar6[10] + iVar11));
                      iVar11 = iVar11 + 1;
                      i = i + 1;
                    } while (iVar11 != 1);
                  }
                  pbVar6[10] = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                                )((char)pbVar6[10] - (char)bVar15);
                  pbVar9[10] = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                                )((char)pbVar9[10] + (char)bVar15);
                  pbVar6 = iter->node;
                  if (((ulong)pbVar6 & 7) == 0) {
                    if ((int)(uint)(byte)pbVar6[10] < iter->position) {
                      iter->position = iter->position + ~(uint)(byte)pbVar6[10];
                      iter->node = pbVar9;
                      pbVar6 = pbVar9;
                    }
                    bVar4 = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                             )0x1e;
                    if (pbVar6[0xb] !=
                        (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                         )0x0) {
                      bVar4 = pbVar6[0xb];
                    }
                    if ((byte)pbVar6[10] < (byte)bVar4) {
                      return;
                    }
                    __assert_fail("node->count() < node->max_count()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                  ,0xb8b,
                                  "void phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                                 );
                  }
                  goto LAB_001b82ee;
                }
              }
            }
            else {
              btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
              ::uninitialized_move_n
                        (pbVar9,uVar7,(long)(int)((byte)bVar4 - uVar16),(ulong)(byte)bVar4,pbVar9,
                         in_R9);
              bVar4 = pbVar9[10];
              if ((byte)bVar15 < (byte)bVar4) {
                uVar5 = ~uVar16 + (uint)(byte)bVar4;
                if (-1 < (int)uVar5) {
                  uVar10 = (ulong)uVar5 * 8 + 0x14;
                  pbVar8 = pbVar9 + (ulong)(uint)(byte)bVar4 * 8 + 8;
                  do {
                    *(undefined4 *)(pbVar8 + -4) = *(undefined4 *)(pbVar9 + (uVar10 - 8));
                    *(undefined4 *)pbVar8 = *(undefined4 *)(pbVar9 + (uVar10 - 4));
                    uVar10 = uVar10 - 8;
                    pbVar8 = pbVar8 + -8;
                  } while (0x13 < uVar10);
                }
              }
              uVar10 = *(ulong *)pbVar6;
              if ((uVar10 & 7) == 0) {
                bVar4 = pbVar6[8];
                *(undefined4 *)(pbVar9 + uVar7 * 8 + 4) =
                     *(undefined4 *)(uVar10 + 0xc + (ulong)(byte)bVar4 * 8);
                *(undefined4 *)(pbVar9 + uVar7 * 8 + 8) =
                     *(undefined4 *)(uVar10 + 0x10 + (ulong)(byte)bVar4 * 8);
                if (uVar7 - 1 != 0) {
                  bVar4 = pbVar6[10];
                  lVar13 = 0;
                  do {
                    pbVar8 = pbVar6 + lVar13 + ((ulong)(byte)bVar4 - (uVar7 - 1)) * 8 + 0xc;
                    *(undefined4 *)(pbVar9 + lVar13 + 0xc) = *(undefined4 *)pbVar8;
                    *(undefined4 *)(pbVar9 + lVar13 + 0x10) = *(undefined4 *)(pbVar8 + 4);
                    lVar13 = lVar13 + 8;
                  } while (pbVar8 + 8 != pbVar6 + (ulong)(byte)bVar4 * 8 + 0xc);
                }
                goto LAB_001b81db;
              }
            }
LAB_001b839b:
            __function = 
            "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, Off..." /* TRUNCATED STRING LITERAL */
            ;
            goto LAB_001b8303;
          }
        }
      }
      cVar3 = *(undefined1 *)((long)&this_00->rightmost_ + 3);
      if ((cVar3 != '\0') && (cVar3 != '\x1e')) {
        __assert_fail("parent->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb93,
                      "void phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                     );
      }
      if (*(undefined1 *)((long)&this_00->rightmost_ + 2) == '\x1e') {
        pbVar9 = iter->node;
        if (((ulong)pbVar9 & 7) != 0) goto LAB_001b8381;
        alloc = *(allocator_type **)pbVar9;
        iter_00 = &local_40;
        local_40.position = (int)(byte)pbVar9[8];
        local_40.node =
             (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
              *)alloc;
        rebalance_or_split(this,iter_00);
      }
LAB_001b7f8a:
      if (((ulong)iter->node & 7) == 0) {
        if (iter->node[0xb] ==
            (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
             )0x0) {
          pbVar9 = new_internal_node(this_00,(node_type *)iter_00);
          btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
          ::split(iter->node,iter->position,pbVar9,alloc);
        }
        else {
          pbVar9 = (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                    *)Allocate<8ul,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>>
                                ((allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>
                                  *)0x100,(size_t)iter_00);
          if (((ulong)pbVar9 & 7) != 0) {
            __function = 
            "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, Off..." /* TRUNCATED STRING LITERAL */
            ;
            goto LAB_001b8303;
          }
          *(btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
            **)pbVar9 = this_00;
          *(undefined4 *)(pbVar9 + 8) = 0x1e000000;
          btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
          ::split(iter->node,iter->position,pbVar9,alloc);
          if (this->rightmost_ == iter->node) {
            this->rightmost_ = pbVar9;
          }
        }
        if (((ulong)iter->node & 7) == 0) {
          bVar4 = iter->node[10];
          if ((int)(uint)(byte)bVar4 < iter->position) {
            iter->position = iter->position + ~(uint)(byte)bVar4;
            iter->node = pbVar9;
          }
          return;
        }
      }
    }
LAB_001b82ee:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, Off..." /* TRUNCATED STRING LITERAL */
    ;
  }
LAB_001b8303:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
        node_type *&node = iter->node;
        int &insert_position = iter->position;
        assert(node->count() == node->max_count());
        assert(kNodeValues == node->max_count());

        // First try to make room on the node by rebalancing.
        node_type *parent = node->parent();
        if (node != root()) {
            if (node->position() > 0) {
                // Try rebalancing with our left sibling.
                node_type *left = parent->child(node->position() - 1);
                assert(left->max_count() == kNodeValues);
                if (left->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the end of the right node then we bias rebalancing to
                    // fill up the left node.
                    int to_move = (kNodeValues - left->count()) /
                        (1 + (insert_position < kNodeValues));
                    to_move = (std::max)(1, to_move);

                    if (((insert_position - to_move) >= 0) ||
                        ((left->count() + to_move) < kNodeValues)) {
                        left->rebalance_right_to_left(to_move, node, mutable_allocator());

                        assert(node->max_count() - node->count() == to_move);
                        insert_position = insert_position - to_move;
                        if (insert_position < 0) {
                            insert_position = insert_position + left->count() + 1;
                            node = left;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            if (node->position() < parent->count()) {
                // Try rebalancing with our right sibling.
                node_type *right = parent->child(node->position() + 1);
                assert(right->max_count() == kNodeValues);
                if (right->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the _beginning of the left node then we bias rebalancing
                    // to fill up the right node.
                    int to_move =
                        (kNodeValues - right->count()) / (1 + (insert_position > 0));
                    to_move = (std::max)(1, to_move);

                    if ((insert_position <= (node->count() - to_move)) ||
                        ((right->count() + to_move) < kNodeValues)) {
                        node->rebalance_left_to_right(to_move, right, mutable_allocator());

                        if (insert_position > node->count()) {
                            insert_position = insert_position - node->count() - 1;
                            node = right;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            // Rebalancing failed, make sure there is room on the parent node for a new
            // value.
            assert(parent->max_count() == kNodeValues);
            if (parent->count() == kNodeValues) {
                iterator parent_iter(node->parent(), node->position());
                rebalance_or_split(&parent_iter);
            }
        } else {
            // Rebalancing not possible because this is the root node.
            // Create a new root node and set the current root node as the child of the
            // new root.
            parent = new_internal_node(parent);
            parent->init_child(0, root());
            mutable_root() = parent;
            // If the former root was a leaf node, then it's now the rightmost node.
            assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
        }

        // Split the node.
        node_type *split_node;
        if (node->leaf()) {
            split_node = new_leaf_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
            if (rightmost_ == node) rightmost_ = split_node;
        } else {
            split_node = new_internal_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
        }

        if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = split_node;
        }
    }